

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::daa(CPU *this)

{
  byte bVar1;
  uint8_t a_tmp;
  CPU *this_local;
  
  bVar1 = this->regs->a;
  if (((this->regs->f & 0x20) != 0) || (9 < (this->regs->a & 0xf))) {
    this->regs->a = this->regs->a + '\x06';
  }
  this->regs->f = this->regs->f & 0xef;
  if (((this->regs->f & 0x20) != 0) || (0x99 < bVar1)) {
    this->regs->a = this->regs->a + '`';
    this->regs->f = this->regs->f | 0x10;
  }
  return 1;
}

Assistant:

int CPU::daa() {
    // CHECK
    uint8_t a_tmp = regs.a;

    if ((regs.f & 0x20) || ((regs.a & 0xF) > 9)) {
        regs.a += 6; 
    }

    regs.f &= 0xEF;
    
    if ((regs.f & 0x20) || (a_tmp > 0x99)) { 
        regs.a += 0x60; 
        regs.f |= 0x10; 
    } 

    return 1;
}